

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9EquivFilter(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  uint local_30;
  int fVerbose;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_30 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar1 == -1) {
      bVar3 = pAbc->pGia != (Gia_Man_t *)0x0;
      if (bVar3) {
        Gia_ManEquivFilter(pAbc->pGia,pAbc->vAbcObjIds,local_30);
      }
      else {
        Abc_Print(-1,"Abc_CommandAbc9EquivFilter(): There is no AIG.\n");
      }
      pAbc_local._4_4_ = (uint)!bVar3;
      return pAbc_local._4_4_;
    }
    if ((iVar1 == 0x68) || (iVar1 != 0x76)) break;
    local_30 = local_30 ^ 1;
  }
  Abc_Print(-2,"usage: &equiv_filter [-vh]\n");
  Abc_Print(-2,"\t              filters equivalence candidates after disproving some SRM outputs\n")
  ;
  Abc_Print(-2,
            "\t              (the array of disproved outputs should be given as pAbc->vAbcObjIds)\n"
           );
  pcVar2 = "no";
  if (local_30 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v          : toggle printing verbose information [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h          : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9EquivFilter( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManEquivFilter( Gia_Man_t * p, Vec_Int_t * vPoIds, int fVerbose );
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9EquivFilter(): There is no AIG.\n" );
        return 1;
    }
    Gia_ManEquivFilter( pAbc->pGia, pAbc->vAbcObjIds, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &equiv_filter [-vh]\n" );
    Abc_Print( -2, "\t              filters equivalence candidates after disproving some SRM outputs\n" );
    Abc_Print( -2, "\t              (the array of disproved outputs should be given as pAbc->vAbcObjIds)\n" );
    Abc_Print( -2, "\t-v          : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h          : print the command usage\n");
    return 1;
}